

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O3

void __thiscall ResolverImp::~ResolverImp(ResolverImp *this)

{
  ResolverThread::stop(this->rt_);
  if ((this->t_)._M_id._M_thread != 0) {
    std::thread::join();
    if ((this->t_)._M_id._M_thread != 0) {
      std::terminate();
    }
  }
  return;
}

Assistant:

~ResolverImp() {
        rt_.stop();
        if (t_.joinable())
            t_.join();
    }